

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar4;
  value_type vVar5;
  
  pFVar4 = (this->left_->fadexpr_).right_;
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  dVar2 = ((pFVar4->fadexpr_).right_)->val_;
  dVar3 = (this->left_->fadexpr_).left_.constant_;
  vVar5 = FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>::val
                    (&this->right_->fadexpr_);
  return vVar5 * (dVar1 + dVar2) * dVar3;
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}